

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

void __thiscall
ParseNodeBlock::ParseNodeBlock
          (ParseNodeBlock *this,charcount_t ichMin,charcount_t ichLim,int blockId,
          PnodeBlockType blockType)

{
  PnodeBlockType blockType_local;
  int blockId_local;
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  ParseNodeBlock *this_local;
  
  ParseNodeStmt::ParseNodeStmt(&this->super_ParseNodeStmt,knopBlock,ichMin,ichLim);
  this->pnodeScopes = (ParseNodePtr)0x0;
  this->pnodeNext = (ParseNodePtr)0x0;
  this->scope = (Scope *)0x0;
  this->enclosingBlock = (ParseNodeBlock *)0x0;
  this->pnodeLexVars = (ParseNodePtr)0x0;
  this->pnodeStmt = (ParseNodePtr)0x0;
  this->pnodeLastValStmt = (ParseNodePtr)0x0;
  this->field_0x5c = this->field_0x5c & 0xfb;
  this->field_0x5c = this->field_0x5c & 0xf7;
  this->field_0x5c = this->field_0x5c & 0xfc | (byte)blockType & 3;
  this->blockId = blockId;
  if (blockType != Regular) {
    (this->super_ParseNodeStmt).super_ParseNode.grfpn =
         (this->super_ParseNodeStmt).super_ParseNode.grfpn | 0x200;
  }
  return;
}

Assistant:

ParseNodeBlock::ParseNodeBlock(charcount_t ichMin, charcount_t ichLim, int blockId, PnodeBlockType blockType)
    : ParseNodeStmt(knopBlock, ichMin, ichLim)
{
    this->pnodeScopes = nullptr;
    this->pnodeNext = nullptr;
    this->scope = nullptr;
    this->enclosingBlock = nullptr;
    this->pnodeLexVars = nullptr;
    this->pnodeStmt = nullptr;
    this->pnodeLastValStmt = nullptr;

    this->callsEval = false;
    this->childCallsEval = false;
    this->blockType = blockType;
    this->blockId = blockId;

    if (blockType != PnodeBlockType::Regular)
    {
        this->grfpn |= PNodeFlags::fpnSyntheticNode;
    }
}